

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O0

void __thiscall
xray_re::cse_alife_object::state_read(cse_alife_object *this,xr_packet *packet,uint16_t size)

{
  uint32_t uVar1;
  uint16_t size_local;
  xr_packet *packet_local;
  cse_alife_object *this_local;
  
  if ((this->super_cse_abstract).m_version != 0) {
    if ((this->super_cse_abstract).m_version < 0x19) {
      xr_packet::r_s8(packet);
    }
    else if ((this->super_cse_abstract).m_version < 0x53) {
      xr_packet::r_float(packet);
    }
    if ((this->super_cse_abstract).m_version < 0x53) {
      xr_packet::r_s32(packet);
    }
    if ((this->super_cse_abstract).m_version < 4) {
      xr_packet::r_u16(packet);
    }
    xr_packet::r_u16(packet,&this->m_graph_id);
    xr_packet::r_float(packet,&this->m_distance);
  }
  if (3 < (this->super_cse_abstract).m_version) {
    uVar1 = xr_packet::r_u32(packet);
    this->m_direct_control = (uVar1 & 1) != 0;
  }
  if (7 < (this->super_cse_abstract).m_version) {
    xr_packet::r_u32(packet,&this->m_node_id);
  }
  if ((0x16 < (this->super_cse_abstract).m_version) && ((this->super_cse_abstract).m_version < 0x50)
     ) {
    xr_packet::r_u16(packet,&(this->super_cse_abstract).m_spawn_id);
  }
  if ((0x17 < (this->super_cse_abstract).m_version) && ((this->super_cse_abstract).m_version < 0x54)
     ) {
    xr_packet::skip_sz(packet);
  }
  if (0x31 < (this->super_cse_abstract).m_version) {
    xr_packet::r_u32(packet,&this->m_flags);
  }
  if (0x39 < (this->super_cse_abstract).m_version) {
    xr_packet::r_sz(packet,&(this->super_cse_abstract).m_ini_string);
  }
  if (0x3d < (this->super_cse_abstract).m_version) {
    xr_packet::r_u32(packet,&this->m_story_id);
  }
  if (0x6f < (this->super_cse_abstract).m_version) {
    xr_packet::r_u32(packet,&this->m_spawn_story_id);
  }
  return;
}

Assistant:

void cse_alife_object::state_read(xr_packet& packet, uint16_t size)
{
	if (m_version >= CSE_VERSION_0x01) {
		if (m_version <= CSE_VERSION_0x18)
			packet.r_s8();
		else if (m_version < CSE_VERSION_0x53)
			packet.r_float();
		if (m_version < CSE_VERSION_0x53)
			packet.r_s32();
		if (m_version < CSE_VERSION_0x04)
			packet.r_u16();
		packet.r_u16(m_graph_id);
		packet.r_float(m_distance);
	}
	if (m_version >= CSE_VERSION_0x04)
		m_direct_control = (packet.r_u32() & 1) != 0;
	if (m_version >= CSE_VERSION_0x08)
		packet.r_u32(m_node_id);
	if (m_version > CSE_VERSION_0x16 && m_version <= CSE_VERSION_0x4f)
		packet.r_u16(m_spawn_id);
	if (m_version > CSE_VERSION_0x17 && m_version < CSE_VERSION_0x54)
		packet.skip_sz();
	if (m_version > CSE_VERSION_0x31)
		packet.r_u32(m_flags);
	if (m_version > CSE_VERSION_0x39)
		packet.r_sz(m_ini_string);
	if (m_version > CSE_VERSION_0x3d)
		packet.r_u32(m_story_id);
	if (m_version > CSE_VERSION_0x6f)
		packet.r_u32(m_spawn_story_id);
}